

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void add_new_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  func_cfg_t pfVar1;
  bb_insn_t pbVar2;
  uint uVar3;
  bb_insn_t_conflict elem;
  size_t *psVar4;
  int iVar5;
  bb_t in_RCX;
  DLIST_bb_t *pDVar6;
  bb_t_conflict bb_00;
  size_t extraout_RDX;
  DLIST_LINK_bb_insn_t *pDVar7;
  gen_ctx_t gen_ctx_00;
  
  if (bb == (bb_t_conflict)0x0) {
    add_new_bb_cold_3();
LAB_0015f139:
    add_new_bb_cold_1();
  }
  else {
    pfVar1 = gen_ctx->curr_cfg;
    in_RCX = (pfVar1->bbs).tail;
    if (in_RCX != (bb_t)0x0) {
      if ((in_RCX->bb_link).next == (bb_t)0x0) {
        pDVar6 = (DLIST_bb_t *)&(in_RCX->bb_link).next;
LAB_0015f10d:
        pDVar6->head = bb;
        (bb->bb_link).next = (bb_t)0x0;
        (bb->bb_link).prev = in_RCX;
        (pfVar1->bbs).tail = bb;
        uVar3 = gen_ctx->curr_bb_index;
        gen_ctx->curr_bb_index = uVar3 + 1;
        bb->index = (ulong)uVar3;
        return;
      }
      goto LAB_0015f139;
    }
    pDVar6 = &pfVar1->bbs;
    if (pDVar6->head == (bb_t_conflict)0x0) goto LAB_0015f10d;
  }
  iVar5 = (int)in_RCX;
  add_new_bb_cold_2();
  elem = create_bb_insn(gen_ctx,(MIR_insn_t)bb,bb_00);
  gen_ctx_00 = (gen_ctx_t)&bb_00->bb_insns;
  if (iVar5 != 0) {
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)gen_ctx_00,elem);
    return;
  }
  pbVar2 = ((DLIST_bb_insn_t *)gen_ctx_00)->head;
  if (pbVar2 == (bb_insn_t)0x0) {
    if ((bb_00->bb_insns).tail != (bb_insn_t)0x0) goto LAB_0015f1a4;
    pDVar7 = (DLIST_LINK_bb_insn_t *)&(bb_00->bb_insns).tail;
  }
  else {
    if ((pbVar2->bb_insn_link).prev != (bb_insn_t)0x0) {
      add_new_bb_insn_cold_1();
LAB_0015f1a4:
      add_new_bb_insn_cold_2();
      uVar3 = (int)bb->bfs - 0xa7;
      if ((uVar3 < 0xe) && ((0x2007U >> (uVar3 & 0x1f) & 1) != 0)) {
        psVar4 = (size_t *)malloc(0x10);
        if (psVar4 == (size_t *)0x0) {
          util_error(gen_ctx_00,"no memory");
        }
        bb->index = (size_t)psVar4;
        *psVar4 = extraout_RDX;
        psVar4[1] = 0;
      }
      else {
        bb->index = extraout_RDX;
      }
      return;
    }
    pDVar7 = &pbVar2->bb_insn_link;
  }
  pDVar7->prev = elem;
  (elem->bb_insn_link).prev = (bb_insn_t)0x0;
  (elem->bb_insn_link).next = pbVar2;
  ((DLIST_bb_insn_t *)gen_ctx_00)->head = elem;
  return;
}

Assistant:

static void add_new_bb (gen_ctx_t gen_ctx, bb_t bb) {
  DLIST_APPEND (bb_t, curr_cfg->bbs, bb);
  bb->index = curr_bb_index++;
}